

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase630::run(TestCase630 *this)

{
  PromiseArena *pPVar1;
  long *plVar2;
  AsyncInputStream AVar3;
  AsyncOutputStream AVar4;
  OwnPromiseNode OVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  TransformPromiseNodeBase *pTVar9;
  long lVar10;
  OwnPromiseNode intermediate_1;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:646:11),_unsigned_long>
  promise;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receivedStream;
  String result2;
  CapabilityPipe pipe;
  String result;
  CapabilityPipe pipe2;
  AsyncIoContext ioContext;
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  AsyncCapabilityStream local_190;
  OwnPromiseNode local_180;
  undefined1 local_178 [8];
  AsyncCapabilityStream local_170;
  TransformPromiseNodeBase *local_160;
  undefined1 local_158 [8];
  long *plStack_150;
  String local_148;
  undefined8 *local_128;
  long *plStack_120;
  undefined1 local_118 [24];
  long *plStack_100;
  String local_f8;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *local_d8 [5];
  long *local_b0;
  undefined8 *local_a8;
  long *local_a0;
  DebugComparison<const_char_(&)[4],_kj::String_&> local_88;
  char *local_60;
  char *pcStack_58;
  byte local_50 [8];
  char *local_48;
  char *pcStack_40;
  byte local_38 [8];
  
  setupAsyncIo();
  (**(code **)(*local_a0 + 0x10))(local_118);
  (**(code **)(*local_a0 + 0x10))(local_d8);
  local_178[4] = '\0';
  local_178[5] = '\0';
  local_178[6] = '\0';
  local_178[7] = '\0';
  local_178[0] = '\0';
  local_178[1] = '\0';
  local_178[2] = '\0';
  local_178[3] = '\0';
  local_158 = (undefined1  [8])0x0;
  plStack_150 = (long *)0x0;
  AsyncCapabilityStream::receiveStream(&local_190);
  AVar3._vptr_AsyncInputStream =
       local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)
           local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_190,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:641:13)>
               ::anon_class_8_1_58f9daff_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060e400;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_158;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] =
         (_func_int *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)
             (local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_190,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:641:13)>
               ::anon_class_8_1_58f9daff_for_func::operator());
    AVar3._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_0060e400;
    AVar3._vptr_AsyncInputStream[-1] = (_func_int *)local_158;
    ((PromiseArenaMember *)(AVar3._vptr_AsyncInputStream + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_148.content.ptr = (char *)pTVar9;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_f8,(OwnPromiseNode *)&local_148,(SourceLocation *)&local_88);
  pcVar6 = local_148.content.ptr;
  local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)local_f8.content.ptr;
  if ((TransformPromiseNodeBase *)local_148.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_148.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar6);
  }
  AVar4._vptr_AsyncOutputStream =
       local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  pPVar1 = (PromiseArena *)
           local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream -
             (long)pPVar1) < 0x30) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_190.super_AsyncIoStream.super_AsyncOutputStream,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:644:11)>
               ::anon_class_16_2_5e707987_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_0060e458;
    *(undefined1 **)((long)pvVar8 + 0x3f0) = local_158;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_178;
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream[1] =
         (_func_int *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)
             (local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream + -6);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_190.super_AsyncIoStream.super_AsyncOutputStream,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:644:11)>
               ::anon_class_16_2_5e707987_for_func::operator());
    ((PromiseArenaMember *)(AVar4._vptr_AsyncOutputStream + -6))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060e458;
    ((PromiseArenaMember *)(AVar4._vptr_AsyncOutputStream + -2))->_vptr_PromiseArenaMember =
         (_func_int **)local_158;
    AVar4._vptr_AsyncOutputStream[-1] = (_func_int *)local_178;
    AVar4._vptr_AsyncOutputStream[-5] = (_func_int *)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_148.content.ptr = (char *)pTVar9;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_f8,(OwnPromiseNode *)&local_148,(SourceLocation *)&local_88);
  pcVar6 = local_148.content.ptr;
  local_180.ptr = (PromiseNode *)local_f8.content.ptr;
  if ((TransformPromiseNodeBase *)local_148.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_148.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar6);
  }
  OVar5.ptr = local_180.ptr;
  pPVar1 = ((local_180.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_180.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_180,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:646:11)>
               ::anon_class_8_1_8ba005cd_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060e4b0;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_178;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((local_180.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)&local_180.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,&local_180,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:646:11)>
               ::anon_class_8_1_8ba005cd_for_func::operator());
    OVar5.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060e4b0;
    OVar5.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_178;
    OVar5.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar5.ptr = local_180.ptr;
  local_160 = pTVar9;
  if (&(local_180.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_180.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  AVar4._vptr_AsyncOutputStream =
       local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  if ((PromiseArenaMember *)
      local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream !=
      (PromiseArenaMember *)0x0) {
    local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar4._vptr_AsyncOutputStream);
  }
  AVar3._vptr_AsyncInputStream =
       local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)
      local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar3._vptr_AsyncInputStream);
  }
  local_128 = (undefined8 *)local_118._16_8_;
  plStack_120 = plStack_100;
  plStack_100 = (long *)0x0;
  AsyncCapabilityStream::sendStream(&local_170,local_d8[1]);
  AVar3._vptr_AsyncInputStream =
       local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)
           local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:654:13)>
               ::anon_class_8_1_89902eac_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060e508;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_118;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] =
         (_func_int *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)
             (local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:654:13)>
               ::anon_class_8_1_89902eac_for_func::operator());
    AVar3._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_0060e508;
    AVar3._vptr_AsyncInputStream[-1] = (_func_int *)local_118;
    ((PromiseArenaMember *)(AVar3._vptr_AsyncInputStream + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_180.ptr = &pTVar9->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_148,&local_180,(SourceLocation *)&local_88);
  OVar5.ptr = local_180.ptr;
  local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)local_148.content.ptr;
  if ((TransformPromiseNodeBase *)local_180.ptr != (TransformPromiseNodeBase *)0x0) {
    local_180.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  AVar4._vptr_AsyncOutputStream =
       local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  pPVar1 = (PromiseArena *)
           local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream -
             (long)pPVar1) < 0x30) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_170.super_AsyncIoStream.super_AsyncOutputStream,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:656:11)>
               ::anon_class_16_2_40a49b79_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_0060e560;
    *(undefined1 **)((long)pvVar8 + 0x3f0) = local_118;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_178 + 4;
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream[1] =
         (_func_int *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)
             (local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream + -6);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_170.super_AsyncIoStream.super_AsyncOutputStream,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:656:11)>
               ::anon_class_16_2_40a49b79_for_func::operator());
    ((OwnPromiseNode *)(AVar4._vptr_AsyncOutputStream + -6))->ptr =
         (PromiseNode *)&PTR_destroy_0060e560;
    ((OwnPromiseNode *)(AVar4._vptr_AsyncOutputStream + -2))->ptr = (PromiseNode *)local_118;
    AVar4._vptr_AsyncOutputStream[-1] = (_func_int *)(local_178 + 4);
    AVar4._vptr_AsyncOutputStream[-5] = (_func_int *)pPVar1;
  }
  local_88.left = (char (*) [4])&DAT_0048a171;
  local_88.right = (String *)&DAT_0048a1d0;
  local_88.op.content.ptr = &DAT_4c0000058b;
  local_180.ptr = &pTVar9->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_148,&local_180,(SourceLocation *)&local_88);
  OVar5.ptr = local_180.ptr;
  local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)local_148.content.ptr;
  if ((TransformPromiseNodeBase *)local_180.ptr != (TransformPromiseNodeBase *)0x0) {
    local_180.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  AVar3._vptr_AsyncInputStream =
       local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)
           local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    pTVar9 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_190,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:658:11)>
               ::anon_class_8_1_8ba005cc_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_0060e5b8;
    *(undefined1 **)((long)pvVar8 + 0x3f8) = local_178 + 4;
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] =
         (_func_int *)0x0;
    pTVar9 = (TransformPromiseNodeBase *)
             (local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(OwnPromiseNode *)&local_190,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:658:11)>
               ::anon_class_8_1_8ba005cc_for_func::operator());
    AVar3._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_0060e5b8;
    AVar3._vptr_AsyncInputStream[-1] = (_func_int *)(local_178 + 4);
    (((TransformPromiseNodeBase *)(AVar3._vptr_AsyncInputStream + -4))->super_PromiseNode).
    super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_40 = "run";
  local_38[0] = 0x8d;
  local_38[1] = '\x02';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\x17';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)pTVar9;
  Promise<kj::String>::wait
            ((Promise<kj::String> *)&local_f8,&local_190.super_AsyncIoStream.super_AsyncOutputStream
            );
  AVar4._vptr_AsyncOutputStream =
       local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  if ((TransformPromiseNodeBase *)
      local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream !=
      (TransformPromiseNodeBase *)0x0) {
    local_190.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar4._vptr_AsyncOutputStream);
  }
  AVar3._vptr_AsyncInputStream =
       local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((TransformPromiseNodeBase *)
      local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (TransformPromiseNodeBase *)0x0) {
    local_190.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar3._vptr_AsyncInputStream);
  }
  AVar4._vptr_AsyncOutputStream =
       local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  if ((TransformPromiseNodeBase *)
      local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream !=
      (TransformPromiseNodeBase *)0x0) {
    local_170.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar4._vptr_AsyncOutputStream);
  }
  AVar3._vptr_AsyncInputStream =
       local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)
      local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_170.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar3._vptr_AsyncInputStream);
  }
  plVar2 = plStack_120;
  if (plStack_120 != (long *)0x0) {
    plStack_120 = (long *)0x0;
    (**(code **)*local_128)(local_128,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_58 = "run";
  local_50[0] = 0x97;
  local_50[1] = '\x02';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\x18';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  Promise<kj::String>::wait((Promise<kj::String> *)&local_148,&local_160);
  local_180.ptr = (PromiseNode *)0x4b858f;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_88,(DebugExpression<char_const(&)[4]> *)&local_180,&local_f8);
  if ((local_88.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x299,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (result)\", _kjCondition, \"bar\", result",
               (char (*) [37])"failed: expected (\"bar\") == (result)",&local_88,
               (char (*) [4])0x4b858f,&local_f8);
  }
  local_180.ptr = (PromiseNode *)0x4d8ac4;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_88,(DebugExpression<char_const(&)[4]> *)&local_180,&local_148);
  if ((local_88.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x29a,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result2)\", _kjCondition, \"foo\", result2"
               ,(char (*) [38])"failed: expected (\"foo\") == (result2)",&local_88,
               (char (*) [4])0x4d8ac4,&local_148);
  }
  sVar7 = local_148.content.size_;
  pcVar6 = local_148.content.ptr;
  if ((TransformPromiseNodeBase *)local_148.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_148.content.ptr = (char *)0x0;
    local_148.content.size_ = 0;
    (**(local_148.content.disposer)->_vptr_ArrayDisposer)
              (local_148.content.disposer,pcVar6,1,sVar7,sVar7,0);
  }
  sVar7 = local_f8.content.size_;
  pcVar6 = local_f8.content.ptr;
  if ((PromiseArenaMember *)local_f8.content.ptr != (PromiseArenaMember *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar6,1,sVar7,sVar7,0);
  }
  pTVar9 = local_160;
  if (local_160 != (TransformPromiseNodeBase *)0x0) {
    local_160 = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pTVar9);
  }
  plVar2 = plStack_150;
  if (plStack_150 != (long *)0x0) {
    plStack_150 = (long *)0x0;
    (*(code *)**(undefined8 **)local_158)(local_158,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  lVar10 = 0x10;
  do {
    plVar2 = *(long **)((long)local_d8 + lVar10 + 8);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)local_d8 + lVar10 + 8) = 0;
      (**(code **)**(undefined8 **)((long)local_d8 + lVar10))
                (*(undefined8 **)((long)local_d8 + lVar10),(long)plVar2 + *(long *)(*plVar2 + -0x10)
                );
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != -0x10);
  lVar10 = 0x10;
  do {
    plVar2 = *(long **)(local_118 + lVar10 + 8);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)(local_118 + lVar10 + 8) = 0;
      (**(code **)**(undefined8 **)(local_118 + lVar10))
                (*(undefined8 **)(local_118 + lVar10),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_a0;
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != -0x10);
  if (local_a0 != (long *)0x0) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_b0;
  if (local_b0 != (long *)0x0) {
    local_b0 = (long *)0x0;
    (*(code *)*local_d8[4]->disposer)(local_d8[4],(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, CapabilityPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newCapabilityPipe();
  auto pipe2 = ioContext.provider->newCapabilityPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  // Expect to receive a stream, then write "bar" to it, then receive "foo" from it.
  Own<AsyncCapabilityStream> receivedStream;
  auto promise = pipe2.ends[1]->receiveStream()
      .then([&](Own<AsyncCapabilityStream> stream) {
    receivedStream = kj::mv(stream);
    return receivedStream->write("bar"_kjb);
  }).then([&]() {
    return receivedStream->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  });

  // Send a stream, then write "foo" to the other end of the sent stream, then receive "bar"
  // from it.
  kj::String result = pipe2.ends[0]->sendStream(kj::mv(pipe.ends[1]))
      .then([&]() {
    return pipe.ends[0]->write("foo"_kjb);
  }).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("bar", result);
  EXPECT_EQ("foo", result2);
}